

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O1

bool __thiscall Table::equals(Table *this,Table b)

{
  char cVar1;
  char cVar2;
  Cell *pCVar3;
  Cell *this_00;
  Cell *pCVar4;
  long lVar5;
  Cell *this_01;
  bool bVar6;
  ulong local_48;
  
  pCVar4 = b.table[0] + 1;
  pCVar3 = this->table[0] + 1;
  local_48 = 0;
  bVar6 = false;
  do {
    cVar1 = Cell::getNumber(this->table[local_48]);
    cVar2 = Cell::getNumber(b.table[local_48]);
    if (cVar1 != cVar2) {
      return bVar6;
    }
    lVar5 = 1;
    this_00 = pCVar4;
    this_01 = pCVar3;
    do {
      if (lVar5 == -1) goto LAB_001039ef;
      cVar1 = Cell::getNumber(this_01);
      cVar2 = Cell::getNumber(this_00);
      lVar5 = lVar5 + -1;
      this_00 = this_00 + 1;
      this_01 = this_01 + 1;
    } while (cVar1 == cVar2);
    if ((ulong)-lVar5 < 2) {
      return bVar6;
    }
LAB_001039ef:
    bVar6 = 1 < local_48;
    local_48 = local_48 + 1;
    pCVar4 = pCVar4 + 3;
    pCVar3 = pCVar3 + 3;
    if (local_48 == 3) {
      return bVar6;
    }
  } while( true );
}

Assistant:

bool Table::equals(Table b) {
    for (int i = 0; i < HEIGHT; i++){
        for (int j = 0; j < WIDTH; j++) {
            if (this->table[i][j].getNumber() != b.table[i][j].getNumber()) {
                return false;
            }
        }
    }
    return true;
}